

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O3

bool __thiscall
llama_model_loader::get_key_or_arr<unsigned_int,512ul>
          (llama_model_loader *this,string *key,array<unsigned_int,_512UL> *result,uint32_t n,
          bool required)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint k;
  int iVar3;
  runtime_error *prVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  uint value;
  ArrayInfo arr_info;
  string local_68;
  ArrayInfo local_48;
  
  k = gguf_find_key((this->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t
                    .super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                    super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                    (key->_M_dataplus)._M_p);
  if ((int)k < 0) {
    if (required) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&local_68,"key not found in model: %s",(key->_M_dataplus)._M_p);
      std::runtime_error::runtime_error(prVar4,(string *)&local_68);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar2 = false;
  }
  else {
    if (0x200 < n) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&local_68,"n > N_MAX: %u > %u for key %s",(ulong)n,0x200,
                        (key->_M_dataplus)._M_p);
      std::runtime_error::runtime_error(prVar4,(string *)&local_68);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = gguf_get_kv_type((this->meta)._M_t.
                             super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                             super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                             super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                             k & 0x7fffffff);
    if (iVar3 == 9) {
      GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv
                (&local_48,
                 (this->meta)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                 super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                 super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,k);
      if (CONCAT44(local_48.length._4_4_,(uint)local_48.length) != (ulong)n) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        format_abi_cxx11_(&local_68,"key %s has wrong array length; expected %u, got %u",
                          (key->_M_dataplus)._M_p,(ulong)n,(ulong)(uint)local_48.length);
        std::runtime_error::runtime_error(prVar4,(string *)&local_68);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar2 = get_arr<unsigned_int,512ul>(this,key,result,required);
    }
    else {
      bVar2 = get_key<unsigned_int>(this,key,(uint *)&local_68,required);
      auVar1 = _DAT_002350d0;
      if (n != 0 && bVar2) {
        lVar5 = (ulong)n - 1;
        auVar7._8_4_ = (int)lVar5;
        auVar7._0_8_ = lVar5;
        auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
        uVar6 = 0;
        auVar7 = auVar7 ^ _DAT_002350d0;
        auVar8 = _DAT_002350b0;
        auVar9 = _DAT_002350c0;
        do {
          auVar10 = auVar9 ^ auVar1;
          iVar3 = auVar7._4_4_;
          if ((bool)(~(auVar10._4_4_ == iVar3 && auVar7._0_4_ < auVar10._0_4_ ||
                      iVar3 < auVar10._4_4_) & 1)) {
            *(undefined4 *)((long)result->_M_elems + uVar6) = local_68._M_dataplus._M_p._0_4_;
          }
          if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
              auVar10._12_4_ <= auVar7._12_4_) {
            *(undefined4 *)((long)result->_M_elems + uVar6 + 4) = local_68._M_dataplus._M_p._0_4_;
          }
          auVar10 = auVar8 ^ auVar1;
          iVar11 = auVar10._4_4_;
          if (iVar11 <= iVar3 && (iVar11 != iVar3 || auVar10._0_4_ <= auVar7._0_4_)) {
            *(undefined4 *)((long)result->_M_elems + uVar6 + 8) = local_68._M_dataplus._M_p._0_4_;
            *(undefined4 *)((long)result->_M_elems + uVar6 + 0xc) = local_68._M_dataplus._M_p._0_4_;
          }
          lVar5 = auVar9._8_8_;
          auVar9._0_8_ = auVar9._0_8_ + 4;
          auVar9._8_8_ = lVar5 + 4;
          lVar5 = auVar8._8_8_;
          auVar8._0_8_ = auVar8._0_8_ + 4;
          auVar8._8_8_ = lVar5 + 4;
          uVar6 = uVar6 + 0x10;
        } while ((n * 4 + 0xc & 0x1ff0) != uVar6);
      }
    }
  }
  return bVar2;
}

Assistant:

bool llama_model_loader::get_key_or_arr(const std::string & key, std::array<T, N_MAX> & result, uint32_t n, bool required) {
        const int kid = gguf_find_key(meta.get(), key.c_str());

        if (kid < 0) {
            if (required) {
                throw std::runtime_error(format("key not found in model: %s", key.c_str()));
            }
            return false;
        }

        if (n > N_MAX) {
            throw std::runtime_error(format("n > N_MAX: %u > %u for key %s", (uint32_t) n, (uint32_t) N_MAX, key.c_str()));
        }

        if (gguf_get_kv_type(meta.get(), kid) == GGUF_TYPE_ARRAY) {
            struct GGUFMeta::ArrayInfo arr_info =
                GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv(meta.get(), kid);

            if (n != arr_info.length) {
                throw std::runtime_error(format("key %s has wrong array length; expected %u, got %u", key.c_str(), n, (uint32_t) arr_info.length));
            }

            return get_arr(key, result, required);
        }

        T value;

        bool ok = get_key(key, value, required);
        if (!ok) {
            return false;
        }

        for (uint32_t i = 0; i < n; i++) {
            result[i] = value;
        }

        return true;
    }